

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.hpp
# Opt level: O0

bool __thiscall tf::Topology::cancelled(Topology *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (*(uint *)(in_RDI + 0x68) & 0x20000000) != 0;
}

Assistant:

inline bool Topology::cancelled() const {
  return _estate.load(std::memory_order_relaxed) & ESTATE::CANCELLED;
}